

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqlite_kv_cursor_seek(unqlite_kv_cursor *pCursor,void *pKey,int nKeyLen,int iPos)

{
  int local_24;
  int rc;
  int iPos_local;
  int nKeyLen_local;
  void *pKey_local;
  unqlite_kv_cursor *pCursor_local;
  
  rc = nKeyLen;
  if (nKeyLen < 0) {
    rc = SyStrlen((char *)pKey);
  }
  if (rc == 0) {
    local_24 = -3;
  }
  else {
    local_24 = (*pCursor->pStore->pIo->pMethods->xSeek)(pCursor,pKey,rc,iPos);
  }
  return local_24;
}

Assistant:

int unqlite_kv_cursor_seek(unqlite_kv_cursor *pCursor,const void *pKey,int nKeyLen,int iPos)
{
	int rc = UNQLITE_OK;
#ifdef UNTRUST
	if( pCursor == 0 ){
		return UNQLITE_CORRUPT;
	}
#endif
	if( nKeyLen < 0 ){
		/* Assume a null terminated string and compute it's length */
		nKeyLen = SyStrlen((const char *)pKey);
	}
	if( !nKeyLen ){
		rc = UNQLITE_EMPTY;
	}else{
		/* Seek to the desired location */
		rc = pCursor->pStore->pIo->pMethods->xSeek(pCursor,pKey,nKeyLen,iPos);
	}
	return rc;
}